

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDFObjectHandle::getArrayItem(QPDFObjectHandle *this,int n)

{
  bool bVar1;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_register_00000034;
  QPDFObjectHandle *this_00;
  QPDFObjectHandle QVar3;
  allocator<char> local_109;
  string local_108;
  shared_ptr<QPDFObject> local_e8;
  shared_ptr<QPDFObject> local_d8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  uint local_74;
  type *local_70;
  type *oh;
  type *success;
  undefined1 local_38 [8];
  Array array;
  int n_local;
  QPDFObjectHandle *this_local;
  
  this_00 = (QPDFObjectHandle *)CONCAT44(in_register_00000034,n);
  array.sp_elements._M_t.
  super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  .super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>.
  _M_head_impl._4_4_ = in_EDX;
  as_array((Array *)local_38,this_00,strict);
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_38);
  if (bVar1) {
    ::qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&success,(Array *)local_38,
                      array.sp_elements._M_t.
                      super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                      .
                      super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
                      ._M_head_impl._4_4_);
    oh = (type *)std::get<0ul,bool,QPDFObjectHandle>((pair<bool,_QPDFObjectHandle> *)&success);
    local_70 = std::get<1ul,bool,QPDFObjectHandle>((pair<bool,_QPDFObjectHandle> *)&success);
    bVar1 = ((ulong)(oh->super_BaseHandle).obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 1) == 0;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"returning null for out of bounds array access",&local_99);
      objectWarning(this_00,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      QTC::TC("qpdf","QPDFObjectHandle array bounds",0);
    }
    else {
      QPDFObjectHandle(this,local_70);
    }
    local_74 = (uint)!bVar1;
    std::pair<bool,_QPDFObjectHandle>::~pair((pair<bool,_QPDFObjectHandle> *)&success);
    if (local_74 != 0) goto LAB_0032cb3a;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"returning null",&local_c1);
    typeWarning(this_00,"array",&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    QTC::TC("qpdf","QPDFObjectHandle array null for non-array",0);
  }
  local_74 = 0;
LAB_0032cb3a:
  ::qpdf::Array::~Array((Array *)local_38);
  _Var2._M_pi = extraout_RDX;
  if (local_74 == 0) {
    std::shared_ptr<QPDFObject>::shared_ptr(&local_e8,(shared_ptr<QPDFObject> *)this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_109);
    QPDF_Null::create((QPDF_Null *)&local_d8,&local_e8,&getArrayItem::msg,&local_108);
    QPDFObjectHandle(this,&local_d8);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_d8);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_e8);
    _Var2._M_pi = extraout_RDX_00;
  }
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::getArrayItem(int n) const
{
    if (auto array = as_array(strict)) {
        if (auto const [success, oh] = array.at(n); success) {
            return oh;
        } else {
            objectWarning("returning null for out of bounds array access");
            QTC::TC("qpdf", "QPDFObjectHandle array bounds");
        }
    } else {
        typeWarning("array", "returning null");
        QTC::TC("qpdf", "QPDFObjectHandle array null for non-array");
    }
    static auto constexpr msg = " -> null returned from invalid array access"sv;
    return QPDF_Null::create(obj, msg, "");
}